

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void __thiscall
ctemplate::Template::Template
          (Template *this,TemplateString *filename,Strip strip,TemplateCache *owner)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  size_t sVar5;
  long lVar6;
  allocator local_29;
  TemplateCache *local_28;
  TemplateCache *owner_local;
  TemplateString *pTStack_18;
  Strip strip_local;
  TemplateString *filename_local;
  Template *this_local;
  
  this->_vptr_Template = (_func_int **)&PTR__Template_001b5100;
  local_28 = owner;
  owner_local._4_4_ = strip;
  pTStack_18 = filename;
  filename_local = (TemplateString *)this;
  pcVar2 = TemplateString::data(filename);
  sVar3 = TemplateString::size(pTStack_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->original_filename_,pcVar2,sVar3,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::__cxx11::string::string((string *)&this->resolved_filename_);
  this->filename_mtime_ = 0;
  this->strip_ = owner_local._4_4_;
  this->state_ = TS_EMPTY;
  this->template_cache_ = local_28;
  this->template_text_ = (char *)0x0;
  this->template_text_len_ = 0;
  this->tree_ = (SectionTemplateNode *)0x0;
  ParseState::ParseState(&this->parse_state_);
  this->initial_context_ = TC_MANUAL;
  this->htmlparser_ = (HtmlParser *)0x0;
  if (1 < kVerbosity) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"2: ");
    poVar4 = std::operator<<(poVar4,"Constructing Template for ");
    pcVar2 = template_file(this);
    poVar4 = std::operator<<(poVar4,pcVar2);
    poVar4 = std::operator<<(poVar4,"; with context ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->initial_context_);
    poVar4 = std::operator<<(poVar4,"; and strip ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->strip_);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  sVar5 = strlen(pcVar2);
  if (3 < sVar5) {
    lVar6 = std::__cxx11::string::c_str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    sVar5 = strlen(pcVar2);
    iVar1 = strcmp((char *)(lVar6 + sVar5 + -3),".js");
    if ((iVar1 == 0) && (this->strip_ == STRIP_WHITESPACE)) {
      this->strip_ = STRIP_BLANK_LINES;
    }
  }
  ReloadIfChangedLocked(this);
  return;
}

Assistant:

Template::Template(const TemplateString& filename, Strip strip,
                   TemplateCache* owner)
    // TODO(csilvers): replace ToString() with an is_immutable() check
    : original_filename_(filename.data(), filename.size()), resolved_filename_(),
      filename_mtime_(0), strip_(strip), state_(TS_EMPTY),
      template_cache_(owner), template_text_(NULL), template_text_len_(0),
      tree_(NULL), parse_state_(),
      initial_context_(TC_MANUAL), htmlparser_(NULL) {
  VLOG(2) << "Constructing Template for " << template_file()
          << "; with context " << initial_context_
          << "; and strip " << strip_ << endl;

  // Preserve whitespace in Javascript files because carriage returns
  // can convey meaning for comment termination and closures
  if (strsuffix(original_filename_.c_str(), ".js") &&
      strip_ == STRIP_WHITESPACE) {
    strip_ = STRIP_BLANK_LINES;
  }
  ReloadIfChangedLocked();
}